

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O0

void __thiscall
Lib::
SkipList<Indexing::LiteralClause,_Indexing::SubstitutionTree<Indexing::LiteralClause>::LDComparator>
::~SkipList(SkipList<Indexing::LiteralClause,_Indexing::SubstitutionTree<Indexing::LiteralClause>::LDComparator>
            *this)

{
  Node *in_RDI;
  SkipList<Indexing::LiteralClause,_Indexing::SubstitutionTree<Indexing::LiteralClause>::LDComparator>
  *unaff_retaddr;
  uint in_stack_ffffffffffffffec;
  
  makeEmpty(unaff_retaddr);
  deallocate(in_RDI,in_stack_ffffffffffffffec);
  return;
}

Assistant:

~SkipList()
  {
    makeEmpty();
    deallocate(_left,SKIP_LIST_MAX_HEIGHT);
  }